

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_ustar(archive_read *a,tar *tar,archive_entry *entry,void *h)

{
  wchar_t wVar1;
  char *pcVar2;
  wchar_t *pwVar3;
  dev_t dVar4;
  char *existing_gname;
  char *existing_uname;
  wchar_t *existing_wcs_pathname;
  char *existing_pathname;
  wchar_t r;
  wchar_t err;
  archive_string as;
  archive_entry_header_ustar *header;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  existing_pathname._4_4_ = L'\0';
  as.buffer_length = (size_t)h;
  pcVar2 = archive_entry_pathname(entry);
  pwVar3 = archive_entry_pathname_w(entry);
  if (((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) &&
     ((pwVar3 == (wchar_t *)0x0 || (*pwVar3 == L'\0')))) {
    _r = (char *)0x0;
    as.length = 0;
    if (*(char *)(as.buffer_length + 0x159) == '\0') {
      as.s = (char *)0x0;
      archive_strncat((archive_string *)&r,(void *)as.buffer_length,100);
    }
    else {
      as.s = (char *)0x0;
      archive_strncat((archive_string *)&r,(void *)(as.buffer_length + 0x159),0x9b);
      if (_r[(long)(as.s + -1)] != '/') {
        archive_strappend_char((archive_string *)&r,'/');
      }
      archive_strncat((archive_string *)&r,(void *)as.buffer_length,100);
    }
    wVar1 = _archive_entry_copy_pathname_l(entry,_r,(size_t)as.s,tar->sconv);
    if ((wVar1 != L'\0') &&
       (existing_pathname._4_4_ = set_conversion_failed_error(a,tar->sconv,"Pathname"),
       existing_pathname._4_4_ == L'\xffffffe2')) {
      return L'\xffffffe2';
    }
    archive_string_free((archive_string *)&r);
  }
  a_local._4_4_ = header_common(a,tar,entry,h);
  if (a_local._4_4_ != L'\xffffffe2') {
    if (a_local._4_4_ < existing_pathname._4_4_) {
      existing_pathname._4_4_ = a_local._4_4_;
    }
    pcVar2 = archive_entry_uname(entry);
    if (((((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) ||
         (wVar1 = _archive_entry_copy_uname_l
                            (entry,(char *)(as.buffer_length + 0x109),0x20,tar->sconv),
         wVar1 == L'\0')) ||
        (existing_pathname._4_4_ = set_conversion_failed_error(a,tar->sconv,"Uname"),
        a_local._4_4_ = existing_pathname._4_4_, existing_pathname._4_4_ != L'\xffffffe2')) &&
       (((pcVar2 = archive_entry_gname(entry), pcVar2 != (char *)0x0 && (*pcVar2 != '\0')) ||
        ((wVar1 = _archive_entry_copy_gname_l
                            (entry,(char *)(as.buffer_length + 0x129),0x20,tar->sconv),
         wVar1 == L'\0' ||
         (existing_pathname._4_4_ = set_conversion_failed_error(a,tar->sconv,"Gname"),
         a_local._4_4_ = existing_pathname._4_4_, existing_pathname._4_4_ != L'\xffffffe2')))))) {
      if ((*(char *)(as.buffer_length + 0x9c) == '3') || (*(char *)(as.buffer_length + 0x9c) == '4')
         ) {
        wVar1 = archive_entry_rdev_is_set(entry);
        if (wVar1 == L'\0') {
          dVar4 = tar_atol((char *)(as.buffer_length + 0x149),8);
          archive_entry_set_rdevmajor(entry,dVar4);
          dVar4 = tar_atol((char *)(as.buffer_length + 0x151),8);
          archive_entry_set_rdevminor(entry,dVar4);
        }
      }
      else {
        archive_entry_set_rdev(entry,0);
      }
      tar->entry_padding = -tar->entry_bytes_remaining & 0x1ff;
      a_local._4_4_ = existing_pathname._4_4_;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
header_ustar(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h)
{
	const struct archive_entry_header_ustar	*header;
	struct archive_string as;
	int err = ARCHIVE_OK, r;

	header = (const struct archive_entry_header_ustar *)h;

	/* Copy name into an internal buffer to ensure null-termination. */
	const char *existing_pathname = archive_entry_pathname(entry);
	const wchar_t *existing_wcs_pathname = archive_entry_pathname_w(entry);
	if ((existing_pathname == NULL || existing_pathname[0] == '\0')
	    && (existing_wcs_pathname == NULL || existing_wcs_pathname[0] == '\0')) {
		archive_string_init(&as);
		if (header->prefix[0]) {
			archive_strncpy(&as, header->prefix, sizeof(header->prefix));
			if (as.s[archive_strlen(&as) - 1] != '/')
				archive_strappend_char(&as, '/');
			archive_strncat(&as, header->name, sizeof(header->name));
		} else {
			archive_strncpy(&as, header->name, sizeof(header->name));
		}
		if (archive_entry_copy_pathname_l(entry, as.s, archive_strlen(&as),
		    tar->sconv) != 0) {
			err = set_conversion_failed_error(a, tar->sconv, "Pathname");
			if (err == ARCHIVE_FATAL)
				return (err);
		}
		archive_string_free(&as);
	}

	/* Handle rest of common fields. */
	r = header_common(a, tar, entry, h);
	if (r == ARCHIVE_FATAL)
		return (r);
	if (r < err)
		err = r;

	/* Handle POSIX ustar fields. */
	const char *existing_uname = archive_entry_uname(entry);
	if (existing_uname == NULL || existing_uname[0] == '\0') {
		if (archive_entry_copy_uname_l(entry,
		    header->uname, sizeof(header->uname), tar->sconv) != 0) {
			err = set_conversion_failed_error(a, tar->sconv, "Uname");
			if (err == ARCHIVE_FATAL)
				return (err);
		}
	}

	const char *existing_gname = archive_entry_gname(entry);
	if (existing_gname == NULL || existing_gname[0] == '\0') {
		if (archive_entry_copy_gname_l(entry,
		    header->gname, sizeof(header->gname), tar->sconv) != 0) {
			err = set_conversion_failed_error(a, tar->sconv, "Gname");
			if (err == ARCHIVE_FATAL)
				return (err);
		}
	}

	/* Parse out device numbers only for char and block specials. */
	if (header->typeflag[0] == '3' || header->typeflag[0] == '4') {
		if (!archive_entry_rdev_is_set(entry)) {
			archive_entry_set_rdevmajor(entry, (dev_t)
			    tar_atol(header->rdevmajor, sizeof(header->rdevmajor)));
			archive_entry_set_rdevminor(entry, (dev_t)
			    tar_atol(header->rdevminor, sizeof(header->rdevminor)));
		}
	} else {
		archive_entry_set_rdev(entry, 0);
	}

	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);

	return (err);
}